

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  long lVar1;
  u16 uVar2;
  uint uVar3;
  u32 uVar4;
  uint uVar5;
  uint uVar6;
  sqlite3_io_methods *psVar7;
  u32 *puVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 aContent;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint *__s;
  uint uVar16;
  ulong uVar17;
  short sVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  size_t __n;
  uint uVar23;
  long lVar24;
  ushort *puVar25;
  uint uVar26;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  uint *puVar31;
  long in_FS_OFFSET;
  undefined1 auVar32 [16];
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar55;
  undefined1 auVar53 [16];
  int iVar56;
  undefined1 auVar54 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar59 [16];
  int isChanged;
  i64 nSize;
  i64 nReq;
  int local_13c;
  undefined1 local_138 [32];
  ht_slot *local_118;
  uint local_10c;
  long local_108;
  uint local_100 [50];
  long local_38;
  long lVar35;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_13c = 0;
  iVar14 = 8;
  if (pWal->readOnly != '\0') goto LAB_0013d550;
  iVar22 = eMode;
  if ((pWal->exclusiveMode != '\0') ||
     (iVar13 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,10), iVar13 == 0)) {
    pWal->ckptLock = '\x01';
    if (eMode != 0) {
      do {
        if (pWal->exclusiveMode != '\0') {
LAB_0013cb83:
          pWal->writeLock = '\x01';
          goto LAB_0013cb92;
        }
        iVar13 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
        if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar13 != 5)) {
          if (iVar13 != 5) {
            if (iVar13 == 0) goto LAB_0013cb83;
            goto LAB_0013cbc3;
          }
          break;
        }
        iVar14 = (*xBusy)(pBusyArg);
      } while (iVar14 != 0);
      xBusy = (_func_int_void_ptr *)0x0;
    }
    iVar22 = 0;
LAB_0013cb92:
    iVar13 = walIndexReadHdr(pWal,&local_13c);
    if (local_13c != 0) {
      psVar7 = pWal->pDbFd->pMethods;
      if (2 < psVar7->iVersion) {
        (*psVar7->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
      }
    }
LAB_0013cbc3:
    if (iVar13 == 0) {
      uVar19 = (pWal->hdr).mxFrame;
      uVar2 = (pWal->hdr).szPage;
      uVar16 = CONCAT22(uVar2,uVar2) & 0x1fe00;
      if ((uVar19 == 0) || (uVar16 == nBuf)) {
        puVar8 = *pWal->apWiData;
        if (puVar8[0x18] < uVar19) {
          uVar3 = (pWal->hdr).nPage;
          iVar13 = 0;
          lVar29 = 1;
          do {
            uVar15 = puVar8[lVar29 + 0x19];
            if (uVar15 < uVar19) {
              iVar14 = (int)lVar29 + 3;
              do {
                if (pWal->exclusiveMode != '\0') {
LAB_0013ccbd:
                  uVar15 = 0xffffffff;
                  if (lVar29 == 1) {
                    uVar15 = uVar19;
                  }
                  puVar8[lVar29 + 0x19] = uVar15;
                  iVar13 = 0;
                  if (pWal->exclusiveMode == '\0') {
                    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar14,1,9);
                  }
                  goto LAB_0013cd0f;
                }
                iVar13 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar14,1,10);
                if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar13 != 5)) {
                  if (iVar13 == 5) goto LAB_0013cce4;
                  if (iVar13 == 0) goto LAB_0013ccbd;
                  __s = (uint *)0x0;
                  goto LAB_0013d4aa;
                }
                iVar13 = (*xBusy)(pBusyArg);
              } while (iVar13 != 0);
              iVar13 = 5;
LAB_0013cce4:
              xBusy = (_func_int_void_ptr *)0x0;
              uVar19 = uVar15;
            }
LAB_0013cd0f:
            lVar29 = lVar29 + 1;
          } while (lVar29 != 5);
          if (uVar19 <= puVar8[0x18]) {
            __s = (uint *)0x0;
            goto LAB_0013cd7b;
          }
          uVar4 = puVar8[0x18];
          uVar15 = (pWal->hdr).mxFrame;
          iVar14 = sqlite3_initialize();
          if (iVar14 == 0) {
            uVar27 = (ulong)(uVar15 + 0x1000) + 0xffffffff021 >> 0xc;
            lVar29 = uVar27 << 0x20;
            __n = (lVar29 >> 0x1b) + (ulong)uVar15 * 2 + 0x28;
            uVar23 = 0x1000;
            if (uVar15 < 0x1000) {
              uVar23 = uVar15;
            }
            __s = (uint *)sqlite3Malloc((ulong)uVar23 * 2 + __n);
            if (__s != (uint *)0x0) {
              iVar14 = (int)uVar27;
              memset(__s,0,__n);
              __s[1] = iVar14 + 1;
              iVar13 = (int)((ulong)(uVar4 + 0x1001) + 0xffffffff021 >> 0xc);
              if (iVar13 <= iVar14) {
                lVar29 = lVar29 >> 0x20;
                lVar30 = (long)iVar13;
                do {
                  local_138._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  local_138._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  iVar13 = walHashGet(pWal,(int)lVar30,(WalHashLoc *)local_138);
                  aContent = local_138._8_8_;
                  auVar12 = _DAT_001ff0a0;
                  if (iVar13 != 0) {
                    sqlite3_free(__s);
                    __s = (uint *)0x0;
                    goto LAB_0013cd7b;
                  }
                  if (lVar30 == lVar29) {
                    uVar27 = (ulong)(uVar15 - local_138._16_4_);
                  }
                  else {
                    uVar27 = (ulong)(local_138._0_8_ - local_138._8_8_) >> 2;
                  }
                  uVar20 = local_138._16_8_ & 0xffffffff;
                  lVar1 = (long)__s + uVar20 * 2 + (long)(int)__s[1] * 0x20 + 8;
                  uVar23 = local_138._16_4_ + 1;
                  local_138._16_4_ = uVar23;
                  uVar26 = (uint)uVar27;
                  if ((int)uVar26 < 1) {
                    local_10c = 0;
                    local_118 = (ht_slot *)0x0;
                    memset(&local_108,0,0xd0);
                    uVar21 = 1;
LAB_0013d351:
                    uVar27 = (ulong)uVar21;
                    puVar31 = local_100 + uVar27 * 4;
                    do {
                      if ((uVar26 >> ((uint)uVar27 & 0x1f) & 1) != 0) {
                        walMerge((u32 *)aContent,*(ht_slot **)puVar31,puVar31[-2],&local_118,
                                 (int *)&local_10c,(ht_slot *)(__n + (long)__s));
                      }
                      uVar27 = uVar27 + 1;
                      puVar31 = puVar31 + 4;
                    } while ((int)uVar27 != 0xd);
                  }
                  else {
                    lVar24 = (uVar27 & 0xffffffff) - 1;
                    auVar32._8_4_ = (int)lVar24;
                    auVar32._0_8_ = lVar24;
                    auVar32._12_4_ = (int)((ulong)lVar24 >> 0x20);
                    lVar24 = (long)(int)__s[1] * 0x20 + uVar20 * 2;
                    auVar32 = auVar32 ^ _DAT_001ff0a0;
                    uVar20 = 0;
                    auVar34 = _DAT_001ff090;
                    auVar36 = _DAT_001ff080;
                    auVar37 = _DAT_001ff070;
                    auVar38 = _DAT_001ff060;
                    do {
                      auVar39 = auVar34 ^ auVar12;
                      iVar14 = auVar32._0_4_;
                      iVar52 = -(uint)(iVar14 < auVar39._0_4_);
                      iVar13 = auVar32._4_4_;
                      auVar40._4_4_ = -(uint)(iVar13 < auVar39._4_4_);
                      iVar56 = auVar32._8_4_;
                      iVar55 = -(uint)(iVar56 < auVar39._8_4_);
                      iVar33 = auVar32._12_4_;
                      auVar40._12_4_ = -(uint)(iVar33 < auVar39._12_4_);
                      auVar49._4_4_ = iVar52;
                      auVar49._0_4_ = iVar52;
                      auVar49._8_4_ = iVar55;
                      auVar49._12_4_ = iVar55;
                      auVar57 = pshuflw(in_XMM8,auVar49,0xe8);
                      auVar42._4_4_ = -(uint)(auVar39._4_4_ == iVar13);
                      auVar42._12_4_ = -(uint)(auVar39._12_4_ == iVar33);
                      auVar42._0_4_ = auVar42._4_4_;
                      auVar42._8_4_ = auVar42._12_4_;
                      auVar59 = pshuflw(in_XMM9,auVar42,0xe8);
                      auVar40._0_4_ = auVar40._4_4_;
                      auVar40._8_4_ = auVar40._12_4_;
                      auVar58 = pshuflw(auVar57,auVar40,0xe8);
                      auVar39._8_4_ = 0xffffffff;
                      auVar39._0_8_ = 0xffffffffffffffff;
                      auVar39._12_4_ = 0xffffffff;
                      auVar39 = (auVar58 | auVar59 & auVar57) ^ auVar39;
                      auVar39 = packssdw(auVar39,auVar39);
                      sVar18 = (short)uVar20;
                      if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(short *)((long)__s + uVar20 * 2 + lVar24 + 8) = sVar18;
                      }
                      auVar40 = auVar42 & auVar49 | auVar40;
                      auVar39 = packssdw(auVar40,auVar40);
                      auVar58._8_4_ = 0xffffffff;
                      auVar58._0_8_ = 0xffffffffffffffff;
                      auVar58._12_4_ = 0xffffffff;
                      auVar39 = packssdw(auVar39 ^ auVar58,auVar39 ^ auVar58);
                      if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
                        *(short *)((long)__s + uVar20 * 2 + lVar24 + 10) = sVar18 + 1;
                      }
                      auVar39 = auVar36 ^ auVar12;
                      iVar52 = -(uint)(iVar14 < auVar39._0_4_);
                      auVar53._4_4_ = -(uint)(iVar13 < auVar39._4_4_);
                      iVar55 = -(uint)(iVar56 < auVar39._8_4_);
                      auVar53._12_4_ = -(uint)(iVar33 < auVar39._12_4_);
                      auVar41._4_4_ = iVar52;
                      auVar41._0_4_ = iVar52;
                      auVar41._8_4_ = iVar55;
                      auVar41._12_4_ = iVar55;
                      auVar48._4_4_ = -(uint)(auVar39._4_4_ == iVar13);
                      auVar48._12_4_ = -(uint)(auVar39._12_4_ == iVar33);
                      auVar48._0_4_ = auVar48._4_4_;
                      auVar48._8_4_ = auVar48._12_4_;
                      auVar53._0_4_ = auVar53._4_4_;
                      auVar53._8_4_ = auVar53._12_4_;
                      auVar39 = auVar48 & auVar41 | auVar53;
                      auVar39 = packssdw(auVar39,auVar39);
                      auVar10._8_4_ = 0xffffffff;
                      auVar10._0_8_ = 0xffffffffffffffff;
                      auVar10._12_4_ = 0xffffffff;
                      auVar39 = packssdw(auVar39 ^ auVar10,auVar39 ^ auVar10);
                      if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(short *)((long)__s + uVar20 * 2 + lVar24 + 0xc) = sVar18 + 2;
                      }
                      auVar42 = pshufhw(auVar41,auVar41,0x84);
                      auVar49 = pshufhw(auVar48,auVar48,0x84);
                      auVar40 = pshufhw(auVar42,auVar53,0x84);
                      auVar43._8_4_ = 0xffffffff;
                      auVar43._0_8_ = 0xffffffffffffffff;
                      auVar43._12_4_ = 0xffffffff;
                      auVar43 = (auVar40 | auVar49 & auVar42) ^ auVar43;
                      auVar42 = packssdw(auVar43,auVar43);
                      if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(short *)((long)__s + uVar20 * 2 + lVar24 + 0xe) = sVar18 + 3;
                      }
                      auVar42 = auVar37 ^ auVar12;
                      iVar52 = -(uint)(iVar14 < auVar42._0_4_);
                      auVar45._4_4_ = -(uint)(iVar13 < auVar42._4_4_);
                      iVar55 = -(uint)(iVar56 < auVar42._8_4_);
                      auVar45._12_4_ = -(uint)(iVar33 < auVar42._12_4_);
                      auVar50._4_4_ = iVar52;
                      auVar50._0_4_ = iVar52;
                      auVar50._8_4_ = iVar55;
                      auVar50._12_4_ = iVar55;
                      auVar39 = pshuflw(auVar39,auVar50,0xe8);
                      auVar44._4_4_ = -(uint)(auVar42._4_4_ == iVar13);
                      auVar44._12_4_ = -(uint)(auVar42._12_4_ == iVar33);
                      auVar44._0_4_ = auVar44._4_4_;
                      auVar44._8_4_ = auVar44._12_4_;
                      in_XMM9 = pshuflw(auVar59 & auVar57,auVar44,0xe8);
                      in_XMM9 = in_XMM9 & auVar39;
                      auVar45._0_4_ = auVar45._4_4_;
                      auVar45._8_4_ = auVar45._12_4_;
                      auVar39 = pshuflw(auVar39,auVar45,0xe8);
                      auVar57._8_4_ = 0xffffffff;
                      auVar57._0_8_ = 0xffffffffffffffff;
                      auVar57._12_4_ = 0xffffffff;
                      auVar57 = (auVar39 | in_XMM9) ^ auVar57;
                      auVar39 = packssdw(auVar57,auVar57);
                      if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        *(short *)((long)__s + uVar20 * 2 + lVar24 + 0x10) = sVar18 + 4;
                      }
                      auVar45 = auVar44 & auVar50 | auVar45;
                      auVar39 = packssdw(auVar45,auVar45);
                      auVar59._8_4_ = 0xffffffff;
                      auVar59._0_8_ = 0xffffffffffffffff;
                      auVar59._12_4_ = 0xffffffff;
                      auVar39 = packssdw(auVar39 ^ auVar59,auVar39 ^ auVar59);
                      if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        *(short *)((long)__s + uVar20 * 2 + lVar24 + 0x12) = sVar18 + 5;
                      }
                      auVar39 = auVar38 ^ auVar12;
                      iVar14 = -(uint)(iVar14 < auVar39._0_4_);
                      auVar54._4_4_ = -(uint)(iVar13 < auVar39._4_4_);
                      iVar56 = -(uint)(iVar56 < auVar39._8_4_);
                      auVar54._12_4_ = -(uint)(iVar33 < auVar39._12_4_);
                      auVar46._4_4_ = iVar14;
                      auVar46._0_4_ = iVar14;
                      auVar46._8_4_ = iVar56;
                      auVar46._12_4_ = iVar56;
                      auVar51._4_4_ = -(uint)(auVar39._4_4_ == iVar13);
                      auVar51._12_4_ = -(uint)(auVar39._12_4_ == iVar33);
                      auVar51._0_4_ = auVar51._4_4_;
                      auVar51._8_4_ = auVar51._12_4_;
                      auVar54._0_4_ = auVar54._4_4_;
                      auVar54._8_4_ = auVar54._12_4_;
                      auVar39 = auVar51 & auVar46 | auVar54;
                      auVar39 = packssdw(auVar39,auVar39);
                      auVar11._8_4_ = 0xffffffff;
                      auVar11._0_8_ = 0xffffffffffffffff;
                      auVar11._12_4_ = 0xffffffff;
                      in_XMM8 = packssdw(auVar39 ^ auVar11,auVar39 ^ auVar11);
                      if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        *(short *)((long)__s + uVar20 * 2 + lVar24 + 0x14) = sVar18 + 6;
                      }
                      auVar39 = pshufhw(auVar46,auVar46,0x84);
                      auVar40 = pshufhw(auVar51,auVar51,0x84);
                      auVar42 = pshufhw(auVar39,auVar54,0x84);
                      auVar47._8_4_ = 0xffffffff;
                      auVar47._0_8_ = 0xffffffffffffffff;
                      auVar47._12_4_ = 0xffffffff;
                      auVar47 = (auVar42 | auVar40 & auVar39) ^ auVar47;
                      auVar39 = packssdw(auVar47,auVar47);
                      if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        *(short *)((long)__s + uVar20 * 2 + lVar24 + 0x16) = sVar18 + 7;
                      }
                      uVar20 = uVar20 + 8;
                      lVar35 = auVar34._8_8_;
                      auVar34._0_8_ = auVar34._0_8_ + 8;
                      auVar34._8_8_ = lVar35 + 8;
                      lVar35 = auVar36._8_8_;
                      auVar36._0_8_ = auVar36._0_8_ + 8;
                      auVar36._8_8_ = lVar35 + 8;
                      lVar35 = auVar37._8_8_;
                      auVar37._0_8_ = auVar37._0_8_ + 8;
                      auVar37._8_8_ = lVar35 + 8;
                      lVar35 = auVar38._8_8_;
                      auVar38._0_8_ = auVar38._0_8_ + 8;
                      auVar38._8_8_ = lVar35 + 8;
                    } while ((uVar26 + 7 & 0xfffffff8) != uVar20);
                    memset(&local_108,0,0xd0);
                    uVar20 = 0;
                    do {
                      local_10c = 1;
                      local_118 = (ht_slot *)(lVar1 + uVar20 * 2);
                      uVar17 = 0;
                      if ((uVar20 & 1) != 0) {
                        do {
                          walMerge((u32 *)aContent,*(ht_slot **)(local_100 + uVar17 * 4),
                                   local_100[(uVar17 * 2 + -1) * 2],&local_118,(int *)&local_10c,
                                   (ht_slot *)(__n + (long)__s));
                          uVar21 = (int)uVar17 + 1;
                          uVar17 = (ulong)uVar21;
                        } while (((uint)uVar20 >> (uVar21 & 0x1f) & 1) != 0);
                      }
                      *(ht_slot **)(local_100 + uVar17 * 4) = local_118;
                      local_100[(uVar17 * 2 + -1) * 2] = local_10c;
                      uVar20 = uVar20 + 1;
                    } while (uVar20 != (uVar27 & 0xffffffff));
                    uVar21 = (int)uVar17 + 1;
                    if (uVar21 < 0xd) goto LAB_0013d351;
                  }
                  __s[lVar30 * 8 + 9] = uVar23;
                  __s[lVar30 * 8 + 8] = local_10c;
                  *(long *)(__s + lVar30 * 8 + 4) = lVar1;
                  *(undefined8 *)(__s + lVar30 * 8 + 6) = aContent;
                  bVar9 = lVar30 < lVar29;
                  lVar30 = lVar30 + 1;
                } while (bVar9);
              }
              do {
                if (pWal->exclusiveMode != '\0') {
LAB_0013d5bc:
                  uVar15 = puVar8[0x18];
                  puVar8[0x20] = uVar19;
                  uVar27 = (ulong)uVar16;
                  uVar23 = (uint)sync_flags >> 2 & 3;
                  if ((uVar23 != 0) &&
                     (iVar13 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar23), iVar13 != 0))
                  goto LAB_0013d825;
                  local_108 = uVar3 * uVar27;
                  local_138._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                  (*pWal->pDbFd->pMethods->xFileControl)(pWal->pDbFd,0x27,(void *)0x0);
                  iVar13 = (*pWal->pDbFd->pMethods->xFileSize)
                                     (pWal->pDbFd,(sqlite3_int64 *)local_138);
                  if (iVar13 != 0) goto LAB_0013d825;
                  if ((long)local_138._0_8_ < local_108) {
                    if ((long)(local_138._0_8_ + (pWal->hdr).mxFrame * uVar27 + 0x10000) < local_108
                       ) {
                      iVar13 = 0xb;
                      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1074b,
                                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70"
                                 );
                      goto LAB_0013d825;
                    }
                    psVar7 = pWal->pDbFd->pMethods;
                    if (psVar7 != (sqlite3_io_methods *)0x0) {
                      (*psVar7->xFileControl)(pWal->pDbFd,5,&local_108);
                    }
                  }
                  uVar26 = __s[1];
                  if ((int)uVar26 < 1) goto LAB_0013d810;
                  uVar21 = 0;
                  goto LAB_0013d6f2;
                }
                iVar13 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,10);
                if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar13 != 5)) {
                  if (iVar13 == 0) goto LAB_0013d5bc;
                  goto LAB_0013cd7b;
                }
                iVar13 = (*xBusy)(pBusyArg);
                iVar14 = 0;
              } while (iVar13 != 0);
              goto LAB_0013cd86;
            }
          }
          sqlite3_free((void *)0x0);
          iVar13 = 7;
        }
        else {
          __s = (uint *)0x0;
          iVar14 = 0;
LAB_0013cd86:
          iVar13 = iVar14;
          if ((iVar22 == 0) || (iVar13 != 0)) {
LAB_0013d4aa:
            sqlite3_free(__s);
            if ((iVar13 != 5) && (iVar13 != 0)) goto LAB_0013d4e9;
          }
          else {
            iVar13 = 5;
            if (((pWal->hdr).mxFrame <= puVar8[0x18]) && (iVar13 = 0, 1 < iVar22)) {
              local_108 = CONCAT44(local_108._4_4_,0xaaaaaaaa);
              sqlite3_randomness(4,&local_108);
              do {
                if (pWal->exclusiveMode != '\0') {
LAB_0013d464:
                  iVar13 = 0;
                  if (iVar22 == 3) {
                    walRestartHdr(pWal,(u32)local_108);
                    iVar13 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
                  }
                  if (pWal->exclusiveMode == '\0') {
                    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
                  }
                  goto LAB_0013d4aa;
                }
                iVar13 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
                if ((xBusy == (_func_int_void_ptr *)0x0) || (iVar13 != 5)) {
                  if (iVar13 == 0) goto LAB_0013d464;
                  goto LAB_0013d4aa;
                }
                iVar14 = (*xBusy)(pBusyArg);
              } while (iVar14 != 0);
              iVar13 = 5;
              goto LAB_0013d4aa;
            }
            sqlite3_free(__s);
          }
          if (pnLog != (int *)0x0) {
            *pnLog = (pWal->hdr).mxFrame;
          }
          if (pnCkpt != (int *)0x0) {
            *pnCkpt = (*pWal->apWiData)[0x18];
          }
        }
      }
      else {
        iVar13 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10f64,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      }
    }
  }
LAB_0013d4e9:
  if (local_13c != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  if (pWal->ckptLock != '\0') {
    if (pWal->exclusiveMode == '\0') {
      (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,9);
    }
    pWal->ckptLock = '\0';
  }
  iVar14 = 5;
  if (iVar13 != 0) {
    iVar14 = iVar13;
  }
  if (iVar22 == eMode) {
    iVar14 = iVar13;
  }
LAB_0013d550:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar14;
  while( true ) {
    if ((((uVar15 < uVar21) && (uVar21 <= uVar19)) && (uVar28 <= uVar3)) &&
       ((iVar13 = (*pWal->pWalFd->pMethods->xRead)
                            (pWal->pWalFd,zBuf,uVar16,
                             (ulong)(uVar21 - 1) * (ulong)(uVar16 | 0x18) + 0x38), iVar13 != 0 ||
        (iVar13 = (*pWal->pDbFd->pMethods->xWrite)(pWal->pDbFd,zBuf,uVar16,(uVar28 - 1) * uVar27),
        iVar13 != 0)))) goto LAB_0013d825;
    uVar26 = __s[1];
    if ((int)uVar26 < 1) break;
LAB_0013d6f2:
    uVar5 = *__s;
    uVar28 = 0xffffffff;
    uVar20 = (ulong)uVar26;
    do {
      uVar17 = uVar20 - 1;
      uVar26 = __s[uVar17 * 8 + 2];
      if ((int)uVar26 < (int)__s[uVar17 * 8 + 8]) {
        puVar31 = __s + uVar17 * 8 + 2;
        puVar25 = (ushort *)((long)(int)uVar26 * 2 + *(long *)(puVar31 + 2));
        do {
          uVar26 = uVar26 + 1;
          uVar6 = *(uint *)(*(long *)(puVar31 + 4) + (ulong)*puVar25 * 4);
          if (uVar5 < uVar6) {
            if (uVar6 < uVar28) {
              uVar21 = (uint)*puVar25 + puVar31[7];
              uVar28 = uVar6;
            }
            break;
          }
          *puVar31 = uVar26;
          puVar25 = puVar25 + 1;
        } while (uVar26 != __s[uVar17 * 8 + 8]);
      }
      bVar9 = 1 < (long)uVar20;
      uVar20 = uVar17;
    } while (bVar9);
    *__s = uVar28;
    if (uVar28 == 0xffffffff) goto LAB_0013d816;
    if ((db->u1).isInterrupted != 0) {
      iVar13 = (uint)(db->mallocFailed == '\0') * 2 + 7;
      goto LAB_0013d825;
    }
  }
LAB_0013d810:
  *__s = 0xffffffff;
LAB_0013d816:
  iVar13 = 0;
LAB_0013d825:
  psVar7 = pWal->pDbFd->pMethods;
  if (psVar7 != (sqlite3_io_methods *)0x0) {
    (*psVar7->xFileControl)(pWal->pDbFd,0x25,(void *)0x0);
  }
  if ((iVar13 == 0) &&
     ((uVar19 != (*pWal->apWiData)[4] ||
      ((iVar13 = (*pWal->pDbFd->pMethods->xTruncate)(pWal->pDbFd,uVar27 * (pWal->hdr).nPage),
       iVar13 == 0 &&
       ((uVar23 == 0 || (iVar13 = (*pWal->pDbFd->pMethods->xSync)(pWal->pDbFd,uVar23), iVar13 == 0))
       )))))) {
    puVar8[0x18] = uVar19;
    iVar13 = 0;
  }
  if (pWal->exclusiveMode == '\0') {
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,9);
  }
LAB_0013cd7b:
  iVar14 = 0;
  if (iVar13 != 5) {
    iVar14 = iVar13;
  }
  goto LAB_0013cd86;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* Enable blocking locks, if possible. */
  sqlite3WalDb(pWal, db);
  if( xBusy2 ) (void)walEnableBlocking(pWal);

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive
  ** "checkpoint" lock on the database file.
  ** EVIDENCE-OF: R-10421-19736 If any other process is running a
  ** checkpoint operation at the same time, the lock cannot be obtained and
  ** SQLITE_BUSY is returned.
  ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
  ** it will not be invoked in this case.
  */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  testcase( rc==SQLITE_BUSY );
  testcase( rc!=SQLITE_OK && xBusy2!=0 );
  if( rc==SQLITE_OK ){
    pWal->ckptLock = 1;

    /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
    ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
    ** file.
    **
    ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
    ** immediately, and a busy-handler is configured, it is invoked and the
    ** writer lock retried until either the busy-handler returns 0 or the
    ** lock is successfully obtained.
    */
    if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
      rc = walBusyLock(pWal, xBusy2, pBusyArg, WAL_WRITE_LOCK, 1);
      if( rc==SQLITE_OK ){
        pWal->writeLock = 1;
      }else if( rc==SQLITE_BUSY ){
        eMode2 = SQLITE_CHECKPOINT_PASSIVE;
        xBusy2 = 0;
        rc = SQLITE_OK;
      }
    }
  }


  /* Read the wal-index header. */
  SEH_TRY {
    if( rc==SQLITE_OK ){
      /* For a passive checkpoint, do not re-enable blocking locks after
      ** reading the wal-index header. A passive checkpoint should not block
      ** or invoke the busy handler. The only lock such a checkpoint may
      ** attempt to obtain is a lock on a read-slot, and it should give up
      ** immediately and do a partial checkpoint if it cannot obtain it. */
      walDisableBlocking(pWal);
      rc = walIndexReadHdr(pWal, &isChanged);
      if( eMode2!=SQLITE_CHECKPOINT_PASSIVE ) (void)walEnableBlocking(pWal);
      if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
        sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
      }
    }

    /* Copy data from the log to the database file. */
    if( rc==SQLITE_OK ){
      if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags,zBuf);
      }

      /* If no error occurred, set the output variables. */
      if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
        if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
        SEH_INJECT_FAULT;
        if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
      }
    }
  }
  SEH_EXCEPT( rc = walHandleException(pWal); )

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  walDisableBlocking(pWal);
  sqlite3WalDb(pWal, 0);

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  if( pWal->ckptLock ){
    walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
    pWal->ckptLock = 0;
  }
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}